

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void bloaty::AddDIE(CU *cu,GeneralDIE *die,DualMap *symbol_map,RangeSink *sink)

{
  char cVar1;
  size_t sVar2;
  File *pFVar3;
  _func_int **pp_Var4;
  bool bVar5;
  size_type __rlen_2;
  CU *cu_00;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  InputFile *pIVar9;
  ulong uVar10;
  pointer pcVar11;
  size_type __rlen;
  MessageLite MVar13;
  char *pcVar14;
  MessageLite filesize;
  uint64_t uVar15;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  IVar16;
  unsigned_long uVar17;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view data;
  uint64_t size;
  RangeSink *this;
  ulong local_70;
  string_view local_60;
  undefined1 local_50 [32];
  size_type sVar12;
  
  cu_00 = (CU *)TryReadPcPair(cu,die,sink);
  if ((die->location_string).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    sVar2 = (die->location_string).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len;
    bVar5 = (cu->unit_sizes_).addr8_;
    if ((sVar2 == (ulong)bVar5 * 4 + 5) &&
       (pcVar14 = (die->location_string).
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_str, *pcVar14 == '\x03')) {
      uVar10 = sVar2 - 1;
      if (bVar5 == false) {
        if (uVar10 < 4) goto LAB_001b0b51;
        uVar7 = (uint64_t)*(uint *)(pcVar14 + 1);
      }
      else {
        if (uVar10 < 8) {
LAB_001b0b51:
          Throw("premature EOF reading fixed-length data",0x8d);
        }
        uVar7 = *(uint64_t *)(pcVar14 + 1);
      }
      bVar5 = RangeMap::TryGetSize(&symbol_map->vm_map,uVar7,(uint64_t *)local_50);
      if (bVar5) {
        RangeSink::AddVMRangeIgnoreDuplicate
                  (sink,"dwarf_location",uVar7,local_50._0_8_,&cu->unit_name_);
      }
      else if (0 < verbose_level) {
        fprintf(_stderr,
                "bloaty: warning: couldn\'t find DWARF location in symbol table, address: %lx, name: %s\n"
                ,uVar7,(cu->unit_name_)._M_dataplus._M_p);
      }
    }
  }
  if ((die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar10 = (die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    uVar6 = (cu->dwarf_->debug_loc)._M_len;
    MVar13._vptr_MessageLite = (_func_int **)(uVar6 - uVar10);
    if (uVar6 < uVar10 || MVar13._vptr_MessageLite == (_func_int **)0x0) {
      if (0 < verbose_level) {
        fprintf(_stderr,"bloaty: warning: DWARF location out of range, location=%lx\n",uVar10);
      }
    }
    else {
      IVar16.ptr_ = (cu->dwarf_->debug_loc)._M_str + uVar10;
      local_50._0_4_ = cu->unit_sizes_;
      local_50._8_8_ = MVar13._vptr_MessageLite;
      local_50._16_8_ = IVar16.ptr_;
      do {
        bVar5 = dwarf::LocationList::NextEntry((LocationList *)local_50);
      } while (bVar5);
      pcVar14 = (sink->file_->data_)._M_str;
      if ((pcVar14 <= IVar16.ptr_) && (IVar16.ptr_ < pcVar14 + (sink->file_->data_)._M_len)) {
        filesize._vptr_MessageLite = (_func_int **)(local_50._16_8_ - (long)IVar16.ptr_);
        if (MVar13._vptr_MessageLite < (_func_int **)(local_50._16_8_ - (long)IVar16.ptr_)) {
          filesize._vptr_MessageLite = MVar13._vptr_MessageLite;
        }
        name._M_str = (cu->unit_name_)._M_dataplus._M_p;
        name._M_len = (cu->unit_name_)._M_string_length;
        RangeSink::AddFileRange
                  (sink,"dwarf_locrange",name,(long)IVar16.ptr_ - (long)pcVar14,
                   (uint64_t)filesize._vptr_MessageLite);
      }
    }
  }
  if ((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar10 = (cu->dwarf_->debug_rnglists)._M_len;
    uVar6 = ((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value <<
            ((cu->unit_sizes_).dwarf64_ & 0x3fU | 2)) + cu->range_lists_base_;
    if (uVar6 <= uVar10) {
      local_50._8_8_ = (cu->dwarf_->debug_rnglists)._M_str + uVar6;
      local_50._0_8_ = (InputFile *)(uVar10 - uVar6);
      uVar7 = dwarf::CompilationUnitSizes::ReadDWARFOffset(&cu->unit_sizes_,(string_view *)local_50)
      ;
      uVar10 = (cu->dwarf_->debug_rnglists)._M_len;
      uVar6 = uVar7 + cu->range_lists_base_;
      local_60._M_len = uVar10 - uVar6;
      if (uVar6 <= uVar10) {
        local_60._M_str = (cu->dwarf_->debug_rnglists)._M_str + uVar6;
        local_70 = cu->addr_base_;
        bVar5 = false;
        local_50._24_8_ = local_60._M_str;
        do {
          if (local_60._M_len == 0) goto LAB_001b0b51;
          cVar1 = *local_60._M_str;
          local_60._M_str = local_60._M_str + 1;
          local_60._M_len = local_60._M_len - 1;
          switch(cVar1) {
          case '\0':
            bVar5 = true;
            break;
          case '\x01':
            uVar15 = dwarf::ReadLEB128Internal(false,&local_60);
            pFVar3 = cu->skeleton_->dwarf_;
            uVar7 = cu->skeleton_->addr_base_;
            uVar10 = (pFVar3->debug_addr)._M_len;
            pcVar14 = (pFVar3->debug_addr)._M_str;
            if ((cu->unit_sizes_).addr8_ == false) {
              uVar6 = uVar7 + uVar15 * 4;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 4) goto LAB_001b0b51;
              local_70 = (ulong)*(uint *)(pcVar14 + uVar6);
            }
            else {
              uVar6 = uVar7 + uVar15 * 8;
              if (uVar10 < uVar6) {
LAB_001b0b62:
                Throw("premature EOF reading variable-length DWARF data",0xad);
              }
              if (uVar10 - uVar6 < 8) goto LAB_001b0b51;
              local_70 = *(ulong *)(pcVar14 + uVar6);
            }
            break;
          case '\x02':
            uVar15 = dwarf::ReadLEB128Internal(false,&local_60);
            pFVar3 = cu->skeleton_->dwarf_;
            uVar7 = cu->skeleton_->addr_base_;
            uVar10 = (pFVar3->debug_addr)._M_len;
            pcVar14 = (pFVar3->debug_addr)._M_str;
            if ((cu->unit_sizes_).addr8_ == false) {
              uVar6 = uVar7 + uVar15 * 4;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 4) goto LAB_001b0b51;
              uVar7 = (uint64_t)*(uint *)(pcVar14 + uVar6);
            }
            else {
              uVar6 = uVar7 + uVar15 * 8;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 8) goto LAB_001b0b51;
              uVar7 = *(uint64_t *)(pcVar14 + uVar6);
            }
            uVar8 = dwarf::ReadLEB128Internal(false,&local_60);
            pFVar3 = cu->skeleton_->dwarf_;
            uVar15 = cu->skeleton_->addr_base_;
            uVar10 = (pFVar3->debug_addr)._M_len;
            pcVar14 = (pFVar3->debug_addr)._M_str;
            if ((cu->unit_sizes_).addr8_ == false) {
              uVar6 = uVar15 + uVar8 * 4;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 4) goto LAB_001b0b51;
              uVar10 = (ulong)*(uint *)(pcVar14 + uVar6);
            }
            else {
              uVar6 = uVar15 + uVar8 * 8;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 8) goto LAB_001b0b51;
              uVar10 = *(ulong *)(pcVar14 + uVar6);
            }
            uVar8 = uVar10 - uVar7;
            goto LAB_001b09c5;
          case '\x03':
            uVar15 = dwarf::ReadLEB128Internal(false,&local_60);
            pFVar3 = cu->skeleton_->dwarf_;
            uVar7 = cu->skeleton_->addr_base_;
            uVar10 = (pFVar3->debug_addr)._M_len;
            pcVar14 = (pFVar3->debug_addr)._M_str;
            if ((cu->unit_sizes_).addr8_ == false) {
              uVar6 = uVar7 + uVar15 * 4;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 4) goto LAB_001b0b51;
              uVar7 = (uint64_t)*(uint *)(pcVar14 + uVar6);
            }
            else {
              uVar6 = uVar7 + uVar15 * 8;
              if (uVar10 < uVar6) goto LAB_001b0b62;
              if (uVar10 - uVar6 < 8) goto LAB_001b0b51;
              uVar7 = *(uint64_t *)(pcVar14 + uVar6);
            }
            uVar8 = dwarf::ReadLEB128Internal(false,&local_60);
            goto LAB_001b09c5;
          case '\x04':
            uVar15 = dwarf::ReadLEB128Internal(false,&local_60);
            uVar7 = local_70 + uVar15;
            uVar8 = dwarf::ReadLEB128Internal(false,&local_60);
            uVar8 = uVar8 - uVar15;
LAB_001b09c5:
            RangeSink::AddVMRangeIgnoreDuplicate(sink,"dwarf_rangelst",uVar7,uVar8,&cu->unit_name_);
            break;
          case '\x05':
          case '\x06':
          case '\a':
            Throw("NYI",0x1fe);
          }
        } while (!bVar5);
        pcVar14 = (sink->file_->data_)._M_str;
        if ((ulong)local_50._24_8_ < pcVar14) {
          return;
        }
        if (pcVar14 + (sink->file_->data_)._M_len <= (ulong)local_50._24_8_) {
          return;
        }
        pcVar11 = (cu->unit_name_)._M_dataplus._M_p;
        sVar12 = (cu->unit_name_)._M_string_length;
        uVar15 = (long)local_60._M_str - local_50._24_8_;
        uVar7 = local_50._24_8_ - (long)pcVar14;
        pcVar14 = "dwarf_rangelst_addrs";
        this = sink;
        goto LAB_001b0ace;
      }
    }
    Throw("region out-of-bounds",100);
  }
  uVar17 = 0xffffffffffffffff;
  if (((die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged & 1U) != 0) {
    uVar17 = (die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  if ((die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != false) {
    uVar17 = (die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  if (uVar17 == 0xffffffffffffffff) {
    return;
  }
  uVar10 = (cu->dwarf_->debug_ranges)._M_len;
  pIVar9 = (InputFile *)(uVar10 - uVar17);
  if (uVar10 < uVar17 || pIVar9 == (InputFile *)0x0) {
    if (verbose_level < 1) {
      return;
    }
    fprintf(_stderr,"bloaty: warning: DWARF debug range out of range, ranges_offset=%lx\n",uVar17);
    return;
  }
  MVar13._vptr_MessageLite = (_func_int **)((cu->dwarf_->debug_ranges)._M_str + uVar17);
  name_01._M_str = (char *)sink;
  name_01._M_len = (size_t)(cu->unit_name_)._M_dataplus._M_p;
  this = sink;
  local_50._0_8_ = pIVar9;
  local_50._8_8_ = MVar13._vptr_MessageLite;
  dwarf::ReadRangeList
            ((dwarf *)cu,cu_00,(cu->unit_name_)._M_string_length,name_01,(RangeSink *)local_50,
             (string_view *)sink);
  pp_Var4 = (_func_int **)(sink->file_->data_)._M_str;
  if (MVar13._vptr_MessageLite < pp_Var4) {
    return;
  }
  if ((_func_int **)((sink->file_->data_)._M_len + (long)pp_Var4) <= MVar13._vptr_MessageLite) {
    return;
  }
  pcVar11 = (cu->unit_name_)._M_dataplus._M_p;
  sVar12 = (cu->unit_name_)._M_string_length;
  uVar15 = local_50._8_8_ - (long)MVar13._vptr_MessageLite;
  uVar7 = (long)MVar13._vptr_MessageLite - (long)pp_Var4;
  pcVar14 = "dwarf_debugrange";
LAB_001b0ace:
  name_00._M_str = pcVar11;
  name_00._M_len = sVar12;
  RangeSink::AddFileRange(this,pcVar14,name_00,uVar7,uVar15);
  return;
}

Assistant:

void AddDIE(const dwarf::CU& cu, const GeneralDIE& die,
            const DualMap& symbol_map, RangeSink* sink) {
  uint64_t low_pc = TryReadPcPair(cu, die, sink);

  // Sometimes the DIE has a "location", which gives the location as an address.
  // This parses a very small subset of the overall DWARF expression grammar.
  if (die.location_string) {
    string_view location = *die.location_string;
    if (location.size() == cu.unit_sizes().address_size() + 1 &&
        location[0] == DW_OP_addr) {
      location.remove_prefix(1);
      uint64_t addr;
      // TODO(haberman): endian?
      if (cu.unit_sizes().address_size() == 4) {
        addr = ReadFixed<uint32_t>(&location);
      } else if (cu.unit_sizes().address_size() == 8) {
        addr = ReadFixed<uint64_t>(&location);
      } else {
        BLOATY_UNREACHABLE();
      }

      // Unfortunately the location doesn't include a size, so we look that part
      // up in the symbol map.
      uint64_t size;
      if (symbol_map.vm_map.TryGetSize(addr, &size)) {
        sink->AddVMRangeIgnoreDuplicate("dwarf_location", addr, size,
                                        cu.unit_name());
      } else {
        if (verbose_level > 0) {
          fprintf(stderr,
                  "bloaty: warning: couldn't find DWARF location in symbol "
                  "table, address: %" PRIx64 ", name: %s\n",
                  addr, cu.unit_name().c_str());
        }
      }
    }
  }

  // Sometimes a location is given as an offset into debug_loc.
  if (die.location_uint64) {
    uint64_t location = *die.location_uint64;;
    if (location < cu.dwarf().debug_loc.size()) {
      std::string_view loc_range = cu.dwarf().debug_loc.substr(location);
      loc_range = GetLocationListRange(cu.unit_sizes(), loc_range);
      sink->AddFileRange("dwarf_locrange", cu.unit_name(), loc_range);
    } else if (verbose_level > 0) {
      fprintf(stderr,
              "bloaty: warning: DWARF location out of range, location=%" PRIx64
              "\n",
              location);
    }
  }

  // DWARF 5 range list is the same information as "ranges" but in a different
  // format.
  if (die.rnglistx) {
    uint64_t range_list = *die.rnglistx;
    size_t offset_size = cu.unit_sizes().dwarf64() ? 8 : 4;
    string_view offset_data =
        StrictSubstr(cu.dwarf().debug_rnglists,
                     cu.range_lists_base() + (range_list * offset_size));
    uint64_t offset = cu.unit_sizes().ReadDWARFOffset(&offset_data);
    string_view data = StrictSubstr(
        cu.dwarf().debug_rnglists, cu.range_lists_base() + offset);
    const char* start = data.data();
    bool done = false;
    uint64_t base_address = cu.addr_base();
    while (!done) {
      switch (ReadFixed<uint8_t>(&data)) {
        case DW_RLE_end_of_list:
          done = true;
          break;
        case DW_RLE_base_addressx:
          base_address =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          break;
        case DW_RLE_startx_endx: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t end =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_startx_length: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t length = dwarf::ReadLEB128<uint64_t>(&data);
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, length,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_offset_pair: {
          uint64_t start = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          uint64_t end = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_base_address:
        case DW_RLE_start_end:
        case DW_RLE_start_length:
          THROW("NYI");
          break;
      }
    }
    string_view all(start, data.data() - start);
    sink->AddFileRange("dwarf_rangelst_addrs", cu.unit_name(), all);
  } else {
    uint64_t ranges_offset = UINT64_MAX;

    // There are two different attributes that sometimes contain an offset into
    // debug_ranges.
    if (die.ranges) {
      ranges_offset = *die.ranges;
    } else if (die.start_scope) {
      ranges_offset = *die.start_scope;
    }

    if (ranges_offset != UINT64_MAX) {
      if (ranges_offset < cu.dwarf().debug_ranges.size()) {
        std::string_view data = cu.dwarf().debug_ranges.substr(ranges_offset);
        const char* start = data.data();
        ReadRangeList(cu, low_pc, cu.unit_name(), sink, &data);
        string_view all(start, data.data() - start);
        sink->AddFileRange("dwarf_debugrange", cu.unit_name(), all);
      } else if (verbose_level > 0) {
        fprintf(stderr,
                "bloaty: warning: DWARF debug range out of range, "
                "ranges_offset=%" PRIx64 "\n",
                ranges_offset);
      }
    }
  }
}